

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
TransitionObservationIndependentMADPDiscrete::JointToIndividualActionIndices
          (TransitionObservationIndependentMADPDiscrete *this,Index ja_e,Scope *agSC)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  Scope *in_RSI;
  allocator_type *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_A_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ja_e_vec;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Index in_stack_ffffffffffffffbc;
  
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RCX);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xabe2d2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(size_type)in_RSI,in_RDI);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xabe2f2);
  (**(code **)((in_RSI->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 0x3c))();
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (this_00,in_RSI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  IndexTools::JointToIndividualIndices
            (in_stack_ffffffffffffffbc,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) & 0xffffffff00ffffff));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI;
}

Assistant:

std::vector<Index> JointToIndividualActionIndices(
        Index ja_e, const Scope& agSC) const
        { 
            // identical to MADPComponentDiscreteActions
            std::vector<size_t> nr_A_e(agSC.size());
            IndexTools::RestrictIndividualIndicesToScope(
                GetNrActions(), agSC, nr_A_e);
            std::vector<Index> ja_e_vec = IndexTools::JointToIndividualIndices(ja_e, nr_A_e);
            return(ja_e_vec);
        }